

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O2

EbmlElement * __thiscall
libebml::EbmlMaster::FindNextElt(EbmlMaster *this,EbmlElement *PastElt,bool bCreateIfNull)

{
  pointer ppEVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer ppEVar6;
  pointer ppEVar7;
  ulong uVar8;
  ulong uVar9;
  EbmlElement *element;
  
  ppEVar6 = (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppEVar7 = (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)ppEVar7 - (long)ppEVar6 >> 3;
  uVar8 = 0;
  do {
    uVar9 = uVar5;
    if (uVar5 == uVar8) break;
    uVar9 = uVar8 + 1;
    ppEVar1 = ppEVar6 + uVar8;
    uVar8 = uVar9;
  } while (*ppEVar1 != PastElt);
  do {
    uVar8 = (long)ppEVar7 - (long)ppEVar6 >> 3;
    if (uVar8 <= uVar9) {
LAB_00191cf5:
      if (uVar8 == uVar9) {
        if (bCreateIfNull) {
          iVar4 = (*PastElt->_vptr_EbmlElement[5])(PastElt);
          element = (EbmlElement *)CONCAT44(extraout_var_01,iVar4);
          PushElement(this,element);
        }
        else {
          element = (EbmlElement *)0x0;
        }
      }
      else {
        element = ppEVar6[uVar9];
      }
      return element;
    }
    iVar3 = (*PastElt->_vptr_EbmlElement[3])(PastElt);
    iVar4 = *(int *)CONCAT44(extraout_var,iVar3);
    lVar2 = *(long *)((int *)CONCAT44(extraout_var,iVar3) + 2);
    iVar3 = (*(this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar9]->_vptr_EbmlElement[3])();
    ppEVar6 = (this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppEVar7 = (this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((*(long *)((int *)CONCAT44(extraout_var_00,iVar3) + 2) == lVar2) &&
       (*(int *)CONCAT44(extraout_var_00,iVar3) == iVar4)) {
      uVar8 = (long)ppEVar7 - (long)ppEVar6 >> 3;
      goto LAB_00191cf5;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

EbmlElement *EbmlMaster::FindNextElt(const EbmlElement & PastElt, bool bCreateIfNull)
{
  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    if ((ElementList[Index]) == &PastElt) {
      // found past element, new one is :
      Index++;
      break;
    }
  }

  while (Index < ElementList.size()) {
    if ((EbmlId)PastElt == (EbmlId)(*ElementList[Index]))
      break;
    Index++;
  }

  if (Index != ElementList.size())
    return ElementList[Index];

  if (bCreateIfNull) {
    // add the element
    EbmlElement *NewElt = &(PastElt.CreateElement());
    if (NewElt == NULL)
      return NULL;

    if (!PushElement(*NewElt)) {
      delete NewElt;
      NewElt = NULL;
    }
    return NewElt;
  }

  return NULL;
}